

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

PatternEquation *
WithBlock::collectAndPrependPattern
          (list<WithBlock,_std::allocator<WithBlock>_> *stack,PatternEquation *pateq)

{
  PatternEquation *pPVar1;
  bool bVar2;
  reference pWVar3;
  _List_node_base *this;
  PatternEquation *witheq;
  _List_node_base *local_28;
  _List_const_iterator<WithBlock> local_20;
  const_iterator iter;
  PatternEquation *pateq_local;
  list<WithBlock,_std::allocator<WithBlock>_> *stack_local;
  
  iter._M_node = (_List_node_base *)pateq;
  std::_List_const_iterator<WithBlock>::_List_const_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::list<WithBlock,_std::allocator<WithBlock>_>::begin(stack);
  local_20._M_node = local_28;
  while( true ) {
    witheq = (PatternEquation *)
             std::__cxx11::list<WithBlock,_std::allocator<WithBlock>_>::end(stack);
    bVar2 = std::operator!=(&local_20,(_Self *)&witheq);
    if (!bVar2) break;
    pWVar3 = std::_List_const_iterator<WithBlock>::operator*(&local_20);
    pPVar1 = pWVar3->pateq;
    if (pPVar1 != (PatternEquation *)0x0) {
      this = (_List_node_base *)operator_new(0x48);
      EquationAnd::EquationAnd
                ((EquationAnd *)this,(PatternEquation *)pPVar1,(PatternEquation *)iter._M_node);
      iter._M_node = this;
    }
    std::_List_const_iterator<WithBlock>::operator++(&local_20);
  }
  return (PatternEquation *)iter._M_node;
}

Assistant:

PatternEquation *WithBlock::collectAndPrependPattern(const list<WithBlock> &stack, PatternEquation *pateq)

{
  list<WithBlock>::const_iterator iter;
  for(iter=stack.begin();iter!=stack.end();++iter) {
    PatternEquation *witheq = (*iter).pateq;
    if (witheq != (PatternEquation *)0)
      pateq = new EquationAnd(witheq, pateq);
  }
  return pateq;
}